

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::Extend
              (double **multi_channel_f0,int number_of_sections,int f0_length,int *boundary_list,
              double **f0_candidates,int number_of_candidates,double allowed_range,
              double **extended_f0,int *shifted_boundary_list)

{
  int iVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  double **in_R8;
  undefined4 in_R9D;
  double in_XMM0_Qa;
  int unaff_retaddr;
  double *in_stack_00000008;
  long in_stack_00000010;
  int i;
  int threshold;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar3 = 100;
  for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    MyMinInt(in_EDX + -2,*(int *)(in_RCX + (long)(iVar2 * 2 + 1) * 4) + iVar3);
    in_stack_ffffffffffffffc0 = in_EDX;
    iVar1 = ExtendF0((double *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                     (int)((ulong)in_R8 >> 0x20),(int)in_R8,
                     (double **)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),unaff_retaddr,in_XMM0_Qa,
                     in_stack_00000008);
    *(int *)(in_stack_00000010 + (long)(iVar2 * 2 + 1) * 4) = iVar1;
    in_stack_ffffffffffffffc4 = *(undefined4 *)(in_RCX + (long)(iVar2 << 1) * 4);
    in_EDX = in_stack_ffffffffffffffc0;
    MyMaxInt(1,*(int *)(in_RCX + (long)(iVar2 << 1) * 4) - iVar3);
    iVar1 = ExtendF0((double *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                     (int)((ulong)in_R8 >> 0x20),(int)in_R8,
                     (double **)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),unaff_retaddr,in_XMM0_Qa,
                     in_stack_00000008);
    *(int *)(in_stack_00000010 + (long)(iVar2 << 1) * 4) = iVar1;
  }
  iVar2 = ExtendSub(in_R8,(int *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                    (int)((ulong)in_XMM0_Qa >> 0x20),(double **)CONCAT44(iVar3,iVar2),
                    (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  return iVar2;
}

Assistant:

static int Extend(const double * const *multi_channel_f0,
    int number_of_sections, int f0_length, const int *boundary_list,
    const double * const *f0_candidates, int number_of_candidates,
    double allowed_range, double **extended_f0, int *shifted_boundary_list) {
  int threshold = 100;
  for (int i = 0; i < number_of_sections; ++i) {
    shifted_boundary_list[i * 2 + 1] = ExtendF0(multi_channel_f0[i],
      f0_length, boundary_list[i * 2 + 1],
      MyMinInt(f0_length - 2, boundary_list[i * 2 + 1] + threshold), 1,
      f0_candidates, number_of_candidates, allowed_range, extended_f0[i]);
    shifted_boundary_list[i * 2] = ExtendF0(multi_channel_f0[i], f0_length,
      boundary_list[i * 2], MyMaxInt(1, boundary_list[i * 2] - threshold), -1,
      f0_candidates, number_of_candidates, allowed_range, extended_f0[i]);
  }

  return ExtendSub(multi_channel_f0, shifted_boundary_list,
    number_of_sections, extended_f0, shifted_boundary_list);
}